

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O0

void ymz280b_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  ymz280b_state *chip;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset <= *(uint *)((long)info + 0x2d8)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 0x2d8) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 0x2d8) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 0x2d0) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void ymz280b_write_rom(void *info, UINT32 offset, UINT32 length, const UINT8* data)
{
	ymz280b_state *chip = (ymz280b_state *)info;
	
	if (offset > chip->mem_size)
		return;
	if (offset + length > chip->mem_size)
		length = chip->mem_size - offset;
	
	memcpy(chip->mem_base + offset, data, length);
	
	return;
}